

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_controls.c
# Opt level: O0

int update(void)

{
  int iVar1;
  int ret;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = update_demo_menu((DEMO_MENU *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (iVar1 == 1000) {
    iVar1 = id();
  }
  else if (iVar1 == 0x3e9) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int update(void)
{
   int ret = update_demo_menu(menu);

   switch (ret) {
      case DEMO_MENU_CONTINUE:
         return id();

      case DEMO_MENU_BACK:
         return DEMO_STATE_OPTIONS;

      default:
         return ret;
   };
}